

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

SUNLinearSolver SUNLinSol_SPFGMR(N_Vector y,int pretype,int maxl,SUNContext_conflict sunctx)

{
  int iVar1;
  SUNLinearSolver p_Var2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  bool bVar5;
  SUNLinearSolverContent_SPFGMR content;
  SUNLinearSolver S;
  SUNContext_conflict sunctx_local_scope_;
  int local_10;
  
  bVar5 = true;
  if ((in_ESI != 1) && (bVar5 = true, in_ESI != 2)) {
    bVar5 = in_ESI == 3;
  }
  iVar1 = 0;
  if (bVar5) {
    iVar1 = 2;
  }
  local_10 = in_EDX;
  if (in_EDX < 1) {
    local_10 = 5;
  }
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(in_RCX);
  p_Var2->ops->gettype = SUNLinSolGetType_SPFGMR;
  p_Var2->ops->getid = SUNLinSolGetID_SPFGMR;
  p_Var2->ops->setatimes = SUNLinSolSetATimes_SPFGMR;
  p_Var2->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPFGMR;
  p_Var2->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPFGMR;
  p_Var2->ops->setzeroguess = SUNLinSolSetZeroGuess_SPFGMR;
  p_Var2->ops->initialize = SUNLinSolInitialize_SPFGMR;
  p_Var2->ops->setup = SUNLinSolSetup_SPFGMR;
  p_Var2->ops->solve = SUNLinSolSolve_SPFGMR;
  p_Var2->ops->numiters = SUNLinSolNumIters_SPFGMR;
  p_Var2->ops->resnorm = SUNLinSolResNorm_SPFGMR;
  p_Var2->ops->resid = SUNLinSolResid_SPFGMR;
  p_Var2->ops->lastflag = SUNLinSolLastFlag_SPFGMR;
  p_Var2->ops->space = SUNLinSolSpace_SPFGMR;
  p_Var2->ops->free = SUNLinSolFree_SPFGMR;
  piVar3 = (int *)malloc(0xa8);
  p_Var2->content = piVar3;
  piVar3[8] = 0;
  *piVar3 = local_10;
  piVar3[1] = iVar1;
  piVar3[2] = 1;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  piVar3[6] = 0;
  piVar3[7] = 0;
  piVar3[0x20] = 0;
  piVar3[0x21] = 0;
  piVar3[0x24] = 0;
  piVar3[0x25] = 0;
  piVar3[0x14] = 0;
  piVar3[0x15] = 0;
  piVar3[0x16] = 0;
  piVar3[0x17] = 0;
  piVar3[10] = 0;
  piVar3[0xb] = 0;
  piVar3[0xc] = 0;
  piVar3[0xd] = 0;
  piVar3[0xe] = 0;
  piVar3[0xf] = 0;
  piVar3[0x10] = 0;
  piVar3[0x11] = 0;
  piVar3[0x12] = 0;
  piVar3[0x13] = 0;
  piVar3[0x18] = 0;
  piVar3[0x19] = 0;
  piVar3[0x1a] = 0;
  piVar3[0x1b] = 0;
  piVar3[0x1c] = 0;
  piVar3[0x1d] = 0;
  piVar3[0x1e] = 0;
  piVar3[0x1f] = 0;
  piVar3[0x22] = 0;
  piVar3[0x23] = 0;
  piVar3[0x26] = 0;
  piVar3[0x27] = 0;
  piVar3[0x28] = 0;
  piVar3[0x29] = 0;
  uVar4 = N_VClone(in_RDI);
  *(undefined8 *)(piVar3 + 0x20) = uVar4;
  uVar4 = N_VClone(in_RDI);
  *(undefined8 *)(piVar3 + 0x24) = uVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_SPFGMR(N_Vector y, int pretype, int maxl,
                                 SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_SPFGMR content;

  /* set preconditioning flag (enabling any preconditioner implies right
     preconditioning, since SPFGMR does not support left preconditioning) */
  pretype = ((pretype == SUN_PREC_LEFT) || (pretype == SUN_PREC_RIGHT) ||
             (pretype == SUN_PREC_BOTH))
              ? SUN_PREC_RIGHT
              : SUN_PREC_NONE;

  /* if maxl input is illegal, set to default */
  if (maxl <= 0) { maxl = SUNSPFGMR_MAXL_DEFAULT; }

  /* check that the supplied N_Vector supports all requisite operations */
  SUNAssertNull((y->ops->nvclone) && (y->ops->nvdestroy) &&
                  (y->ops->nvlinearsum) && (y->ops->nvconst) && (y->ops->nvprod) &&
                  (y->ops->nvdiv) && (y->ops->nvscale) && (y->ops->nvdotprod),
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPFGMR;
  S->ops->getid             = SUNLinSolGetID_SPFGMR;
  S->ops->setatimes         = SUNLinSolSetATimes_SPFGMR;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPFGMR;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPFGMR;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPFGMR;
  S->ops->initialize        = SUNLinSolInitialize_SPFGMR;
  S->ops->setup             = SUNLinSolSetup_SPFGMR;
  S->ops->solve             = SUNLinSolSolve_SPFGMR;
  S->ops->numiters          = SUNLinSolNumIters_SPFGMR;
  S->ops->resnorm           = SUNLinSolResNorm_SPFGMR;
  S->ops->resid             = SUNLinSolResid_SPFGMR;
  S->ops->lastflag          = SUNLinSolLastFlag_SPFGMR;
  S->ops->space             = SUNLinSolSpace_SPFGMR;
  S->ops->free              = SUNLinSolFree_SPFGMR;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPFGMR)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag    = 0;
  content->maxl         = maxl;
  content->pretype      = pretype;
  content->gstype       = SUNSPFGMR_GSTYPE_DEFAULT;
  content->max_restarts = SUNSPFGMR_MAXRS_DEFAULT;
  content->zeroguess    = SUNFALSE;
  content->numiters     = 0;
  content->resnorm      = ZERO;
  content->xcor         = NULL;
  content->vtemp        = NULL;
  content->s1           = NULL;
  content->s2           = NULL;
  content->ATimes       = NULL;
  content->ATData       = NULL;
  content->Psetup       = NULL;
  content->Psolve       = NULL;
  content->PData        = NULL;
  content->V            = NULL;
  content->Z            = NULL;
  content->Hes          = NULL;
  content->givens       = NULL;
  content->yg           = NULL;
  content->cv           = NULL;
  content->Xv           = NULL;

  /* Allocate content */
  content->xcor = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}